

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testC14N.c
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  xmlChar **inclusive_namespaces;
  char *pcVar3;
  int mode;
  char *pcVar4;
  
  xmlInitParser();
  xmlCheckVersion(0x33072);
  if (argc < 3) {
    main_cold_2();
LAB_0010164b:
    uVar2 = 0xffffffff;
    goto LAB_001016a7;
  }
  pcVar4 = argv[1];
  iVar1 = strcmp(pcVar4,"--with-comments");
  if (iVar1 == 0) {
    pcVar4 = argv[2];
    if (argc == 3) {
      pcVar3 = (char *)0x0;
    }
    else {
      pcVar3 = argv[3];
    }
    iVar1 = 1;
LAB_00101627:
    mode = 0;
  }
  else {
    iVar1 = strcmp(pcVar4,"--without-comments");
    if (iVar1 == 0) {
      pcVar4 = argv[2];
      if (argc == 3) {
        pcVar3 = (char *)0x0;
      }
      else {
        pcVar3 = argv[3];
      }
      iVar1 = 0;
      goto LAB_00101627;
    }
    iVar1 = strcmp(pcVar4,"--1-1-with-comments");
    if (iVar1 == 0) {
      pcVar4 = argv[2];
      if (argc == 3) {
        pcVar3 = (char *)0x0;
      }
      else {
        pcVar3 = argv[3];
      }
      iVar1 = 1;
LAB_00101698:
      mode = 2;
    }
    else {
      iVar1 = strcmp(pcVar4,"--1-1-without-comments");
      if (iVar1 == 0) {
        pcVar4 = argv[2];
        if (argc == 3) {
          pcVar3 = (char *)0x0;
        }
        else {
          pcVar3 = argv[3];
        }
        iVar1 = 0;
        goto LAB_00101698;
      }
      iVar1 = strcmp(pcVar4,"--exc-with-comments");
      if (iVar1 != 0) {
        iVar1 = strcmp(pcVar4,"--exc-without-comments");
        if (iVar1 != 0) {
          main_cold_1();
          goto LAB_0010164b;
        }
        if ((uint)argc < 5) {
          pcVar4 = argv[2];
          if (argc != 3) {
            pcVar3 = argv[3];
            iVar1 = 0;
            goto LAB_001016f0;
          }
          iVar1 = 0;
LAB_001016d6:
          mode = 1;
          pcVar3 = (char *)0x0;
          goto LAB_0010169d;
        }
        inclusive_namespaces = parse_list((xmlChar *)argv[4]);
        pcVar4 = argv[2];
        pcVar3 = argv[3];
        iVar1 = 0;
LAB_00101670:
        uVar2 = test_c14n(pcVar4,iVar1,1,pcVar3,inclusive_namespaces);
        if (inclusive_namespaces != (xmlChar **)0x0) {
          (*_xmlFree)(inclusive_namespaces);
        }
        goto LAB_001016a7;
      }
      if (4 < (uint)argc) {
        inclusive_namespaces = parse_list((xmlChar *)argv[4]);
        pcVar4 = argv[2];
        pcVar3 = argv[3];
        iVar1 = 1;
        goto LAB_00101670;
      }
      pcVar4 = argv[2];
      if (argc == 3) {
        iVar1 = 1;
        goto LAB_001016d6;
      }
      pcVar3 = argv[3];
      iVar1 = 1;
LAB_001016f0:
      mode = 1;
    }
  }
LAB_0010169d:
  uVar2 = test_c14n(pcVar4,iVar1,mode,pcVar3,(xmlChar **)0x0);
LAB_001016a7:
  xmlCleanupParser();
  xmlMemoryDump();
  return uVar2 >> 0x1f;
}

Assistant:

int main(int argc, char **argv) {
    int ret = -1;

    /*
     * Init libxml
     */
    xmlInitParser();
    LIBXML_TEST_VERSION

    /*
     * Parse command line and process file
     */
    if( argc < 3 ) {
	fprintf(stderr, "Error: wrong number of arguments.\n");
	usage(argv[0]);
    } else if(strcmp(argv[1], "--with-comments") == 0) {
	ret = test_c14n(argv[2], 1, XML_C14N_1_0, (argc > 3) ? argv[3] : NULL, NULL);
    }